

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::deactivate(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *this,timer_object_holder<timertt::thread_safety::unsafe> *timer)

{
  timer_kind kind;
  timer_type *timer_00;
  timer_type *list_timer;
  timer_object_holder<timertt::thread_safety::unsafe> *timer_local;
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  
  timer_00 = timer_object_holder<timertt::thread_safety::unsafe>::
             cast_to<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                       (timer);
  if (*(int *)&(timer_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc == 1) {
    remove_timer_from_list(this,timer_00);
    kind = timer_type::kind(timer_00);
    engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
    ::dec_timer_count(&this->
                       super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                      ,kind);
    *(undefined4 *)&(timer_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
    timer_object<timertt::thread_safety::unsafe>::decrement_references
              (&timer_00->super_timer_object<timertt::thread_safety::unsafe>);
  }
  else if (*(int *)&(timer_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc == 2) {
    *(undefined4 *)&(timer_00->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 3;
  }
  return;
}

Assistant:

void
	deactivate(
		//! Timer to be deactivated.
		timer_object_holder< THREAD_SAFETY > timer )
	{
		auto list_timer = timer.template cast_to< timer_type >();
		if( timer_status::active == list_timer->m_status )
		{
			// This is normal active timer. It can be safely
			// deactivated and destroyed.
			remove_timer_from_list( list_timer );
			// Count of timers in the list changed.
			this->dec_timer_count( list_timer->kind() );

			list_timer->m_status = timer_status::deactivated;

			// Release timer object.
			timer_object< THREAD_SAFETY >::decrement_references( list_timer );
		}
		else if( timer_status::wait_for_execution == list_timer->m_status )
		{
			// This timer is in execution list right now.
			// We can only change its status.
			// Final deactivation will be done after execution of
			// timers actions.
			list_timer->m_status = timer_status::wait_for_deactivation;
		}
	}